

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

string * __thiscall
pfederc::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this,Lexer *lexer)

{
  allocator<char> local_a;
  allocator<char> local_9;
  
  if (this->type == TOK_KW_FALSE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"False",&local_a);
  }
  else if (this->type == TOK_KW_TRUE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"True",&local_9);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&lexer->fileContent);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Token::toString(const Lexer &lexer) const noexcept {
	switch(getType()) {
	case TokenType::TOK_KW_TRUE:
		return "True";
	case TokenType::TOK_KW_FALSE:
		return "False";
	default:
  	return lexer.getFileContent().substr(getPosition().startIndex,
  	  getPosition().endIndex - getPosition().startIndex + 1);
	}
}